

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O1

void armci_init_domains(MPI_Comm comm)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  char *__ptr;
  int *piVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  char *__s1;
  char *__s;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int size;
  int rank;
  char name [256];
  int local_154;
  int local_150;
  int local_14c;
  char *local_148;
  MPI_Comm local_140;
  undefined1 local_138 [264];
  long lVar12;
  
  iVar3 = MPI_Comm_rank(comm,&local_150);
  if (iVar3 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x22,"void armci_init_domains(MPI_Comm)");
  }
  iVar3 = MPI_Comm_size(comm,&local_154);
  if (iVar3 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x24,"void armci_init_domains(MPI_Comm)");
  }
  lVar9 = (long)local_154;
  __ptr = (char *)malloc(lVar9 << 8);
  piVar5 = (int *)malloc(lVar9 << 2);
  MPI_Get_processor_name(local_138,&local_14c);
  iVar3 = MPI_Allgather(local_138,0x100,&ompi_mpi_char,__ptr,0x100,&ompi_mpi_char,comm);
  if (iVar3 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x2d,"void armci_init_domains(MPI_Comm)");
  }
  *piVar5 = 1;
  iVar3 = 0;
  if (1 < local_154) {
    iVar8 = local_154 + -1;
    iVar3 = 0;
    __s1 = __ptr;
    local_148 = __ptr;
    local_140 = comm;
    do {
      __s = __s1 + 0x100;
      sVar6 = strlen(__s);
      iVar4 = strncmp(__s1,__s,(long)(int)sVar6);
      if (iVar4 != 0) {
        lVar9 = (long)iVar3;
        iVar3 = iVar3 + 1;
        piVar5[lVar9 + 1] = 0;
      }
      piVar5[iVar3] = piVar5[iVar3] + 1;
      iVar8 = iVar8 + -1;
      __ptr = local_148;
      __s1 = __s;
      comm = local_140;
      local_14c = (int)sVar6;
    } while (iVar8 != 0);
  }
  _number_of_procs_per_node = *piVar5;
  if (0 < iVar3) {
    bVar1 = true;
    uVar7 = 1;
    do {
      if (piVar5[uVar7] != _number_of_procs_per_node) {
        bVar1 = false;
      }
      uVar7 = uVar7 + 1;
    } while (iVar3 + 1 != uVar7);
    if (!bVar1) {
      _number_of_procs_per_node = 1;
      goto LAB_0015fa26;
    }
  }
  local_150 = local_150 / _number_of_procs_per_node;
LAB_0015fa26:
  _my_node_id = local_150;
  free(__ptr);
  free(piVar5);
  iVar8 = MPI_Barrier(comm);
  iVar3 = _number_of_procs_per_node;
  if (iVar8 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x56,"void armci_init_domains(MPI_Comm)");
  }
  lVar9 = (long)_number_of_procs_per_node;
  if (1 < lVar9) {
    piVar5 = (int *)malloc(lVar9 * 4);
    auVar2 = _DAT_001b20d0;
    iVar8 = _my_node_id * iVar3;
    lVar9 = lVar9 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar10 = auVar10 ^ _DAT_001b20d0;
    auVar11 = _DAT_001b20c0;
    do {
      auVar13 = auVar11 ^ auVar2;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        *(int *)((long)piVar5 + lVar9) = iVar8;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        *(int *)((long)piVar5 + lVar9 + 4) = iVar8 + 1;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar9 = lVar9 + 8;
      iVar8 = iVar8 + 2;
    } while ((ulong)(iVar3 + 1U >> 1) << 3 != lVar9);
    comex_group_create(iVar3,piVar5,0,&ARMCI_Node_group);
    free(piVar5);
  }
  return;
}

Assistant:

void armci_init_domains(MPI_Comm comm)
{
  int i, status;
  char name[MPI_MAX_PROCESSOR_NAME];
  char *namebuf, *buf_ptr, *prev_ptr;
  int namelen, rank, size, nprocs;
  int *nodeid, *nodesize;
  int ncnt;

  status = MPI_Comm_rank(comm, &rank);
  assert(MPI_SUCCESS == status);
  status = MPI_Comm_size(comm, &size);
  assert(MPI_SUCCESS == status);

  /* determine number of processors per node. First find node name */
  namebuf = (char*)malloc(MPI_MAX_PROCESSOR_NAME*size*sizeof(char));
  nodeid = (int*)malloc(size*sizeof(int));
  nodesize = (int*)malloc(size*sizeof(int));
  MPI_Get_processor_name(name, &namelen);
  status = MPI_Allgather(name,MPI_MAX_PROCESSOR_NAME,MPI_CHAR,namebuf,
      MPI_MAX_PROCESSOR_NAME,MPI_CHAR,comm);
  assert(MPI_SUCCESS == status);

  /* Bin all processors with the same node name */
  ncnt = 0;
  nodeid[0] = ncnt;
  nodesize[0] = 1;
  prev_ptr = namebuf;
  buf_ptr = namebuf+MPI_MAX_PROCESSOR_NAME;
  for (i=1; i<size; i++) {
    namelen = strlen(buf_ptr);
    if (strncmp(prev_ptr,buf_ptr,namelen) != 0) {
      ncnt++;
      nodesize[ncnt]=0;
    }
    nodeid[i] = ncnt;
    nodesize[ncnt]++;
    prev_ptr += MPI_MAX_PROCESSOR_NAME;
    buf_ptr += MPI_MAX_PROCESSOR_NAME;
  }
  ncnt++;
  /* check to see if all nodes have the same number of processors */
  status = 1;
  nprocs = nodesize[0];
  for (i=1; i<ncnt; i++) {
    if (nodesize[i] != nprocs) status = 0;
  }
  /* uneven number of processors per node so bail out and assume each
   * processor is a node */
  if (!status) {
    _number_of_procs_per_node = 1;
    _my_node_id = rank;
  } else {
    /* Same number of processors for all nodes so set domain variables */
    _number_of_procs_per_node = nprocs;
    _my_node_id = rank/_number_of_procs_per_node;
  }

  free(namebuf);
  free(nodeid);
  free(nodesize);
  status = MPI_Barrier(comm);
  assert(MPI_SUCCESS == status);
  /* Create a comex group on the node */
  if (_number_of_procs_per_node > 1) {
    int *nodelist = (int*)malloc(_number_of_procs_per_node*sizeof(int));
    for (i=0; i<_number_of_procs_per_node; i++)
      nodelist[i] = _my_node_id*_number_of_procs_per_node+i;
    comex_group_create(_number_of_procs_per_node, nodelist,
        COMEX_GROUP_WORLD, &ARMCI_Node_group);
    free(nodelist);
  }
}